

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O3

int ARKStepGetTimestepperStats
              (void *arkode_mem,long *expsteps,long *accsteps,long *step_attempts,long *fe_evals,
              long *fi_evals,long *nlinsetups,long *netfails)

{
  ARKodeHAdaptMem pAVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem local_38;
  ARKodeMem local_30;
  
  iVar2 = arkStep_AccessARKODEStepMem(arkode_mem,"ARKStepGetTimestepperStats",&local_30,&local_38);
  if (iVar2 == 0) {
    pAVar1 = local_30->hadapt_mem;
    *expsteps = pAVar1->nst_exp;
    *accsteps = pAVar1->nst_acc;
    *step_attempts = local_30->nst_attempts;
    *fe_evals = local_38->nfe;
    *fi_evals = local_38->nfi;
    *nlinsetups = local_38->nsetups;
    *netfails = local_30->netf;
  }
  return iVar2;
}

Assistant:

int ARKStepGetTimestepperStats(void* arkode_mem, long int* expsteps,
                               long int* accsteps, long int* step_attempts,
                               long int* fe_evals, long int* fi_evals,
                               long int* nlinsetups, long int* netfails)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set expsteps and accsteps from adaptivity structure */
  *expsteps = ark_mem->hadapt_mem->nst_exp;
  *accsteps = ark_mem->hadapt_mem->nst_acc;

  /* set remaining outputs */
  *step_attempts = ark_mem->nst_attempts;
  *fe_evals      = step_mem->nfe;
  *fi_evals      = step_mem->nfi;
  *nlinsetups    = step_mem->nsetups;
  *netfails      = ark_mem->netf;

  return (ARK_SUCCESS);
}